

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O1

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator*
          (ChFrame<double> *__return_storage_ptr__,ChFrame<double> *this,ChFrame<double> *Fb)

{
  ChQuaternion<double> local_38;
  
  local_38.m_data[0] = 1.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  (__return_storage_ptr__->coord).pos.m_data[0] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[0] = 1.0;
  (__return_storage_ptr__->coord).rot.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&__return_storage_ptr__->Amatrix,&local_38);
  TransformLocalToParent(this,Fb,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<Real> operator*(const ChFrame<Real>& Fb) const {
        ChFrame<Real> res;
        TransformLocalToParent(Fb, res);
        return res;
    }